

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsmJsByteCodeGenerator.cpp
# Opt level: O0

void Js::AsmJSByteCodeGenerator::EmitEmptyByteCode
               (FuncInfo *funcInfo,ByteCodeGenerator *byteCodeGen,ParseNode *functionNode)

{
  ParseableFunctionInfo *pPVar1;
  ParseNodeFnc *node;
  ByteCodeGenerator *functionWrite;
  uint32 uVar2;
  uint sourceIndex;
  uint32 uVar3;
  ByteCodeWriter *pBVar4;
  ArenaAllocator *alloc;
  byte local_45;
  undefined1 local_38 [8];
  AutoCleanup autoCleanup;
  FunctionBody *functionBody;
  ParseNode *functionNode_local;
  ByteCodeGenerator *byteCodeGen_local;
  FuncInfo *funcInfo_local;
  
  pPVar1 = funcInfo->byteCodeFunction;
  uVar2 = ByteCodeGenerator::GetFlags(byteCodeGen);
  ParseableFunctionInfo::SetGrfscr(pPVar1,uVar2);
  pPVar1 = funcInfo->byteCodeFunction;
  sourceIndex = ByteCodeGenerator::GetCurrentSourceIndex(byteCodeGen);
  node = funcInfo->root;
  uVar2 = ByteCodeGenerator::GetFlags(byteCodeGen);
  uVar3 = ByteCodeGenerator::GetFlags(byteCodeGen);
  local_45 = 0;
  if ((uVar3 & 0x20) != 0) {
    uVar3 = ByteCodeGenerator::GetFlags(byteCodeGen);
    local_45 = (uVar3 & 0x800) != 0 ^ 0xff;
  }
  ParseableFunctionInfo::SetSourceInfo
            (pPVar1,sourceIndex,node,(uVar2 & 0x800) != 0,(bool)(local_45 & 1));
  autoCleanup.mByteCodeGen =
       (ByteCodeGenerator *)
       FunctionProxy::GetFunctionBody(&funcInfo->byteCodeFunction->super_FunctionProxy);
  EmitEmptyByteCode(FuncInfo*,ByteCodeGenerator*,ParseNode*)::AutoCleanup::AutoCleanup(Js::
  FunctionBody__ByteCodeGenerator__(local_38,(FunctionBody *)autoCleanup.mByteCodeGen,byteCodeGen);
  pBVar4 = ByteCodeGenerator::Writer(byteCodeGen);
  functionWrite = autoCleanup.mByteCodeGen;
  alloc = ByteCodeGenerator::GetAllocator(byteCodeGen);
  ByteCodeWriter::Begin(pBVar4,(FunctionBody *)functionWrite,alloc,false,false,false);
  pBVar4 = ByteCodeGenerator::Writer(byteCodeGen);
  ByteCodeWriter::StartStatement(pBVar4,functionNode,0);
  pBVar4 = ByteCodeGenerator::Writer(byteCodeGen);
  ByteCodeWriter::Empty(pBVar4,Nop);
  pBVar4 = ByteCodeGenerator::Writer(byteCodeGen);
  ByteCodeWriter::EndStatement(pBVar4,functionNode);
  pBVar4 = ByteCodeGenerator::Writer(byteCodeGen);
  ByteCodeWriter::End(pBVar4);
  FunctionBody::CheckAndSetConstantCount((FunctionBody *)autoCleanup.mByteCodeGen,2);
  EmitEmptyByteCode::AutoCleanup::Done((AutoCleanup *)local_38);
  EmitEmptyByteCode::AutoCleanup::~AutoCleanup((AutoCleanup *)local_38);
  return;
}

Assistant:

void AsmJSByteCodeGenerator::EmitEmptyByteCode(FuncInfo * funcInfo, ByteCodeGenerator * byteCodeGen, ParseNode * functionNode)
    {
        funcInfo->byteCodeFunction->SetGrfscr(byteCodeGen->GetFlags());
        funcInfo->byteCodeFunction->SetSourceInfo(byteCodeGen->GetCurrentSourceIndex(),
            funcInfo->root,
            !!(byteCodeGen->GetFlags() & fscrEvalCode),
            ((byteCodeGen->GetFlags() & fscrDynamicCode) && !(byteCodeGen->GetFlags() & fscrEvalCode)));

        FunctionBody * functionBody = funcInfo->byteCodeFunction->GetFunctionBody();

        class AutoCleanup
        {
        private:
            FunctionBody * mFunctionBody;
            ByteCodeGenerator * mByteCodeGen;
        public:
            AutoCleanup(FunctionBody * functionBody, ByteCodeGenerator * byteCodeGen) : mFunctionBody(functionBody), mByteCodeGen(byteCodeGen)
            {
            }

            void Done()
            {
                mFunctionBody = nullptr;
            }
            ~AutoCleanup()
            {
                if (mFunctionBody)
                {
                    mFunctionBody->ResetByteCodeGenState();
                    mByteCodeGen->Writer()->Reset();
                }
            }
        } autoCleanup(functionBody, byteCodeGen);

        byteCodeGen->Writer()->Begin(functionBody, byteCodeGen->GetAllocator(), false, false, false);
        byteCodeGen->Writer()->StartStatement(functionNode, 0);
        byteCodeGen->Writer()->Empty(OpCode::Nop);
        byteCodeGen->Writer()->EndStatement(functionNode);
        byteCodeGen->Writer()->End();

        functionBody->CheckAndSetConstantCount(FuncInfo::InitialConstRegsCount);

        autoCleanup.Done();
    }